

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool __thiscall
ON_BoundingBox::GetFarPoint
          (ON_BoundingBox *this,ON_BoundingBox *other_box,ON_3dPoint *this_point,
          ON_3dPoint *other_point)

{
  ON_3dPoint *this_00;
  ON_3dPoint *this_01;
  bool bVar1;
  double *pdVar2;
  int i;
  int i_00;
  ON_BoundingBox *pOVar3;
  ON_BoundingBox *pOVar4;
  ON_3dPoint *pOVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_Interval Io;
  ON_Interval It;
  ON_Interval local_50;
  ON_Interval local_40;
  
  bVar1 = IsNotEmpty(this);
  if (bVar1) {
    bVar1 = IsNotEmpty(other_box);
    i_00 = 0;
    if (bVar1) {
      this_01 = &this->m_max;
      this_00 = &other_box->m_max;
      do {
        dVar6 = ON_3dPoint::operator[](&this->m_min,i_00);
        dVar7 = ON_3dPoint::operator[](this_01,i_00);
        ON_Interval::ON_Interval(&local_40,dVar6,dVar7);
        dVar6 = ON_3dPoint::operator[](&other_box->m_min,i_00);
        dVar7 = ON_3dPoint::operator[](this_00,i_00);
        ON_Interval::ON_Interval(&local_50,dVar6,dVar7);
        bVar1 = ON_Interval::Includes(&local_40,&local_50,false);
        pOVar3 = (ON_BoundingBox *)this_00;
        if ((bVar1) || (bVar1 = ON_Interval::Includes(&local_50,&local_40,false), bVar1)) {
          dVar6 = ON_3dPoint::operator[](this_01,i_00);
          dVar7 = ON_3dPoint::operator[](&other_box->m_min,i_00);
          dVar8 = ON_3dPoint::operator[](this_00,i_00);
          dVar9 = ON_3dPoint::operator[](&this->m_min,i_00);
          if (dVar6 - dVar7 <= dVar8 - dVar9) {
            dVar6 = ON_3dPoint::operator[](&this->m_min,i_00);
            pdVar2 = ON_3dPoint::operator[](this_point,i_00);
            *pdVar2 = dVar6;
          }
          else {
            dVar6 = ON_3dPoint::operator[](this_01,i_00);
            pdVar2 = ON_3dPoint::operator[](this_point,i_00);
            *pdVar2 = dVar6;
            pOVar3 = other_box;
          }
LAB_003e32eb:
          pOVar4 = pOVar3;
          pOVar5 = other_point;
        }
        else {
          dVar6 = ON_3dPoint::operator[](&this->m_min,i_00);
          dVar7 = ON_3dPoint::operator[](&other_box->m_min,i_00);
          pOVar5 = other_point;
          pOVar4 = other_box;
          if (dVar6 < dVar7) {
            pOVar5 = this_point;
            pOVar4 = this;
          }
          dVar6 = ON_3dPoint::operator[](&pOVar4->m_min,i_00);
          pdVar2 = ON_3dPoint::operator[](pOVar5,i_00);
          *pdVar2 = dVar6;
          dVar6 = ON_3dPoint::operator[](this_01,i_00);
          dVar7 = ON_3dPoint::operator[](this_00,i_00);
          pOVar4 = (ON_BoundingBox *)this_01;
          pOVar5 = this_point;
          if (dVar6 <= dVar7) goto LAB_003e32eb;
        }
        dVar6 = ON_3dPoint::operator[](&pOVar4->m_min,i_00);
        pdVar2 = ON_3dPoint::operator[](pOVar5,i_00);
        *pdVar2 = dVar6;
        i_00 = i_00 + 1;
      } while (i_00 != 3);
      i_00 = 1;
    }
  }
  else {
    i_00 = 0;
  }
  return SUB41(i_00,0);
}

Assistant:

bool ON_BoundingBox::GetFarPoint( 
       const ON_BoundingBox& other_box, // "other" bounding box
       ON_3dPoint& this_point, // point on "this" box that is farthest from "other" box point
       ON_3dPoint& other_point // point on "other" box that is farthest from "this" box point
       )  const
{
	if(!IsValid() || !other_box.IsValid())
		return false;
	for(int i=0; i<3; i++){
		ON_Interval It(m_min[i], m_max[i]);
		ON_Interval Io(other_box.m_min[i], other_box.m_max[i]);
		if( It.Includes(Io) || Io.Includes(It)){
			if( m_max[i] - other_box.m_min[i] > other_box.m_max[i] - m_min[i]){
				this_point[i] = m_max[i];
				other_point[i] = other_box.m_min[i];
			} else {
				this_point[i] = m_min[i];
				other_point[i] = other_box.m_max[i];
			}
		} else {
			if( m_min[i]< other_box.m_min[i]){
				this_point[i]=m_min[i];
			} else {
				other_point[i] = other_box.m_min[i];
			}
			if( m_max[i]> other_box.m_max[i]){
				this_point[i]=m_max[i];
			} else {
				other_point[i] = other_box.m_max[i];
			}
		}
	}
	return true;
}